

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionDeclarationNode *node)

{
  _List_node_base *p_Var1;
  element_type *peVar2;
  FunctionDeclarationNode *pFVar3;
  ostream *poVar4;
  const_iterator cVar5;
  undefined8 uVar6;
  PrintVisitor visitor;
  long *local_70;
  long local_68;
  long local_60 [2];
  FunctionDeclarationNode *local_50;
  undefined **local_48;
  ostream *local_40;
  int local_38;
  
  poVar4 = this->stream_;
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)this->indentation_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"FunctionDeclarationNode (",0x19);
  cVar5 = std::
          _Hashtable<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&TypeNameStrings_abi_cxx11_._M_h,&node->returnType_);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,*(char **)((long)cVar5.
                                                super__Node_iterator_base<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                ._M_cur + 0x10),
                        *(long *)((long)cVar5.
                                        super__Node_iterator_base<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                        ._M_cur + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"):\n",3);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    poVar4 = this->stream_;
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)this->indentation_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Name: ",6);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(node->name_)._M_dataplus._M_p,(node->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    poVar4 = this->stream_;
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)this->indentation_);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Arguments:\n",0xb);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    p_Var1 = (node->arguments_).
             super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    local_50 = node;
    while( true ) {
      if (p_Var1 == (_List_node_base *)&node->arguments_) {
        poVar4 = this->stream_;
        local_38 = this->indentation_ + 1;
        local_48 = &PTR__Visitor_001e93c0;
        local_70 = local_60;
        local_40 = poVar4;
        std::__cxx11::string::_M_construct((ulong)&local_70,(char)this->indentation_);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_70,local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Body:\n",6);
        pFVar3 = local_50;
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        peVar2 = (pFVar3->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*(peVar2->super_StatementNode).super_Node._vptr_Node[2])(peVar2,&local_48);
        return;
      }
      poVar4 = this->stream_;
      local_70 = local_60;
      std::__cxx11::string::_M_construct((ulong)&local_70,(char)this->indentation_);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)p_Var1[1]._M_next,(long)p_Var1[1]._M_prev);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
      cVar5 = std::
              _Hashtable<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&TypeNameStrings_abi_cxx11_._M_h,(key_type *)(p_Var1 + 3));
      if (cVar5.
          super__Node_iterator_base<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) break;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,*(char **)((long)cVar5.
                                                  super__Node_iterator_base<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                                  ._M_cur + 0x10),
                          *(long *)((long)cVar5.
                                          super__Node_iterator_base<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                          ._M_cur + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      p_Var1 = p_Var1->_M_next;
    }
    std::__throw_out_of_range("_Map_base::at");
  }
  uVar6 = std::__throw_out_of_range("_Map_base::at");
  _Unwind_Resume(uVar6);
}

Assistant:

void PrintVisitor::visit(const FunctionDeclarationNode& node)
{
  stream_ << indent() << "FunctionDeclarationNode (" 
    << TypeNameStrings.at(node.getReturnType()) << "):\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    stream_ << indent() << " " << arg.first 
      << " (" << TypeNameStrings.at(arg.second) << ")\n";
  }
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Body:\n";
  node.getBody()->accept(visitor);
}